

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

int pybind11::detail::generic_type::init(EVP_PKEY_CTX *ctx)

{
  string msg;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&msg);
  std::__cxx11::string::append((char *)&msg);
  PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&msg);
  return -1;
}

Assistant:

static int init(void *self, PyObject *, PyObject *) {
        PyTypeObject *type = Py_TYPE(self);
        std::string msg;
#if defined(PYPY_VERSION)
        msg += handle((PyObject *) type).attr("__module__").cast<std::string>() + ".";
#endif
        msg += type->tp_name;
        msg += ": No constructor defined!";
        PyErr_SetString(PyExc_TypeError, msg.c_str());
        return -1;
    }